

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O1

void Saturation::ProvingHelper::runVampireSaturationImpl(Problem *prb,Options *opt)

{
  UnitList *units;
  MainLoop *this;
  MainLoopResult sres;
  _Alloc_hider in_stack_ffffffffffffff98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  MainLoopResult local_48;
  
  Kernel::Unit::onPreprocessingEnd();
  if ((*(char *)(::Lib::env + 0x913a) != '\0') || ((*(byte *)(::Lib::env + 0xa1d2) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[PP] onPreprocessingEnd(), Proving Helper",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    units = prb->_units;
    in_stack_ffffffffffffff98._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff98,"New: ","");
    Shell::UIHelper::outputAllPremises
              ((ostream *)&std::cout,units,(string *)&stack0xffffffffffffff98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff98._M_p != &local_58) {
      operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
    }
  }
  Indexing::TermSharing::setPoly(DAT_00b7e1b8);
  Shell::Options::resolveAwayAutoValues
            ((Options *)in_stack_ffffffffffffff98._M_p,(Problem *)0x68a44f);
  *(undefined4 *)(DAT_00b7e1c0 + 600) = 0x18;
  this = Kernel::MainLoop::createFromOptions(prb,opt);
  Kernel::MainLoop::run(&local_48,this);
  *(undefined4 *)(DAT_00b7e1c0 + 600) = 0x1c;
  ::Lib::Timer::disableLimitEnforcement();
  Kernel::MainLoopResult::updateStatistics(&local_48);
  (*this->_vptr_MainLoop[1])(this);
  return;
}

Assistant:

void ProvingHelper::runVampireSaturationImpl(Problem& prb, const Options& opt)
{
  Unit::onPreprocessingEnd();
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] onPreprocessingEnd(), Proving Helper" << std::endl;
    UIHelper::outputAllPremises(std::cout, prb.units(), "New: ");
  }

  //decide whether to use poly or mono well-typedness test
  //after options have been read. Equality Proxy can introduce poly in mono.
  env.sharing->setPoly();

  env.options->resolveAwayAutoValues(prb);

  env.statistics->phase=ExecutionPhase::SATURATION;
  ScopedPtr<MainLoop> salg(MainLoop::createFromOptions(prb, opt));

  MainLoopResult sres(salg->run());
  env.statistics->phase=ExecutionPhase::FINALIZATION;
  Timer::disableLimitEnforcement();
  sres.updateStatistics();
}